

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O0

string * __thiscall
glcts::DrawBuffersIndexedBlending::GenVS_abi_cxx11_
          (string *__return_storage_ptr__,DrawBuffersIndexedBlending *this)

{
  ostringstream local_190 [8];
  ostringstream os;
  DrawBuffersIndexedBlending *this_local;
  
  os._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,
                  "#version 300 es                        \nprecision highp float;                 \nprecision highp int;                   \nlayout(location = 0) in vec4 position; \nvoid main() {                          \n    gl_Position = position;            \n}"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawBuffersIndexedBlending::GenVS()
{
	std::ostringstream os;
	os << "#version 300 es                        \n"
		  "precision highp float;                 \n"
		  "precision highp int;                   \n"
		  "layout(location = 0) in vec4 position; \n"
		  "void main() {                          \n"
		  "    gl_Position = position;            \n"
		  "}";
	return os.str();
}